

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O3

void __thiscall FGameConfigFile::FGameConfigFile(FGameConfigFile *this)

{
  bool bVar1;
  undefined1 in_SIL;
  undefined1 tryProg;
  FString pathname;
  undefined1 local_20 [8];
  FString local_18;
  FString FVar2;
  
  FConfigFile::FConfigFile(&this->super_FConfigFile);
  (this->super_FConfigFile)._vptr_FConfigFile = (_func_int **)&PTR__FGameConfigFile_0086f400;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_18.Chars = FString::NullString.Nothing;
  (this->super_FConfigFile).OkayToWrite = false;
  this->bModSetup = false;
  GetConfigPath((FGameConfigFile *)local_20,(bool)in_SIL);
  FString::operator=(&local_18,(FString *)local_20);
  FString::~FString((FString *)local_20);
  FVar2.Chars = local_18.Chars;
  FConfigFile::ChangePathName(&this->super_FConfigFile,local_18.Chars);
  tryProg = SUB81(FVar2.Chars,0);
  FConfigFile::LoadConfigFile(&this->super_FConfigFile);
  GetConfigPath((FGameConfigFile *)local_20,(bool)tryProg);
  FString::operator=(&local_18,(FString *)local_20);
  FString::~FString((FString *)local_20);
  FConfigFile::ChangePathName(&this->super_FConfigFile,local_18.Chars);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"IWADSearch.Directories",false);
  if (!bVar1) {
    FConfigFile::SetSection(&this->super_FConfigFile,"IWADSearch.Directories",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path",".",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path","$DOOMWADDIR",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path","~/.config/gzdoom",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path","/usr/local/share/doom",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path","/usr/local/share/games/doom",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path","/usr/share/doom",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path","/usr/share/games/doom",true);
  }
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"FileSearch.Directories",false);
  if (!bVar1) {
    FConfigFile::SetSection(&this->super_FConfigFile,"FileSearch.Directories",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path","~/.config/gzdoom",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path","/usr/local/share/",true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path","$DOOMWADDIR",true);
  }
  FConfigFile::SetSectionNote
            (&this->super_FConfigFile,"IWADSearch.Directories",
             "# These are the directories to automatically search for IWADs.\n# Each directory should be on a separate line, preceded by Path=\n"
            );
  FConfigFile::SetSectionNote
            (&this->super_FConfigFile,"FileSearch.Directories",
             "# These are the directories to search for wads added with the -file\n# command line parameter, if they cannot be found with the path\n# as-is. Layout is the same as for IWADSearch.Directories\n"
            );
  FString::~FString(&local_18);
  return;
}

Assistant:

FGameConfigFile::FGameConfigFile ()
{
#ifdef __APPLE__
	FString user_docs, user_app_support, local_app_support;
#endif
	FString pathname;

	OkayToWrite = false;	// Do not allow saving of the config before DoGameSetup()
	bModSetup = false;
	pathname = GetConfigPath (true);
	ChangePathName (pathname);
	LoadConfigFile ();

	// If zdoom.ini was read from the program directory, switch
	// to the user directory now. If it was read from the user
	// directory, this effectively does nothing.
	pathname = GetConfigPath (false);
	ChangePathName (pathname);

	// Set default IWAD search paths if none present
	if (!SetSection ("IWADSearch.Directories"))
	{
		SetSection ("IWADSearch.Directories", true);
		SetValueForKey ("Path", ".", true);
		SetValueForKey ("Path", "$DOOMWADDIR", true);
#ifdef __APPLE__
		char cpath[PATH_MAX];
		FSRef folder;
		
		if (noErr == FSFindFolder(kUserDomain, kDocumentsFolderType, kCreateFolder, &folder) &&
			noErr == FSRefMakePath(&folder, (UInt8*)cpath, PATH_MAX))
		{
			user_docs << cpath << "/" GAME_DIR;
			SetValueForKey("Path", user_docs, true);
		}
		else
		{
			SetValueForKey("Path", "~/" GAME_DIR, true);
		}
		if (noErr == FSFindFolder(kUserDomain, kApplicationSupportFolderType, kCreateFolder, &folder) &&
			noErr == FSRefMakePath(&folder, (UInt8*)cpath, PATH_MAX))
		{
			user_app_support << cpath << "/" GAME_DIR;
			SetValueForKey("Path", user_app_support, true);
		}
		SetValueForKey ("Path", "$PROGDIR", true);
		if (noErr == FSFindFolder(kLocalDomain, kApplicationSupportFolderType, kCreateFolder, &folder) &&
			noErr == FSRefMakePath(&folder, (UInt8*)cpath, PATH_MAX))
		{
			local_app_support << cpath << "/" GAME_DIR;
			SetValueForKey("Path", local_app_support, true);
		}
#elif !defined(__unix__)
		SetValueForKey ("Path", "$HOME", true);
		SetValueForKey ("Path", "$PROGDIR", true);
#else
		SetValueForKey ("Path", "~/" GAME_DIR, true);
		// Arch Linux likes them in /usr/share/doom
		// Debian likes them in /usr/share/games/doom
		// I assume other distributions don't do anything radically different
		SetValueForKey ("Path", "/usr/local/share/doom", true);
		SetValueForKey ("Path", "/usr/local/share/games/doom", true);
		SetValueForKey ("Path", "/usr/share/doom", true);
		SetValueForKey ("Path", "/usr/share/games/doom", true);
#endif
	}

	// Set default search paths if none present
	if (!SetSection ("FileSearch.Directories"))
	{
		SetSection ("FileSearch.Directories", true);
#ifdef __APPLE__
		SetValueForKey ("Path", user_docs, true);
		SetValueForKey ("Path", user_app_support, true);
		SetValueForKey ("Path", "$PROGDIR", true);
		SetValueForKey ("Path", local_app_support, true);
#elif !defined(__unix__)
		SetValueForKey ("Path", "$PROGDIR", true);
#else
		SetValueForKey ("Path", "~/" GAME_DIR, true);
		SetValueForKey ("Path", SHARE_DIR, true);
#endif
		SetValueForKey ("Path", "$DOOMWADDIR", true);
	}

	// Add some self-documentation.
	SetSectionNote("IWADSearch.Directories",
		"# These are the directories to automatically search for IWADs.\n"
		"# Each directory should be on a separate line, preceded by Path=\n");
	SetSectionNote("FileSearch.Directories",
		"# These are the directories to search for wads added with the -file\n"
		"# command line parameter, if they cannot be found with the path\n"
		"# as-is. Layout is the same as for IWADSearch.Directories\n");
}